

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O0

void __thiscall SchemaConverter::check_errors(SchemaConverter *this)

{
  bool bVar1;
  runtime_error *this_00;
  undefined8 uVar2;
  allocator<char> *in_RDI;
  string *in_stack_000000a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000000a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  FILE *__stream;
  char *in_stack_ffffffffffffff08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  string local_a0 [35];
  undefined1 local_7d;
  string local_28 [40];
  
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(in_stack_ffffffffffffff10);
  if (!bVar1) {
    local_7d = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_RDI);
    string_join(in_stack_000000a8,in_stack_000000a0);
    std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::runtime_error::runtime_error(this_00,local_28);
    local_7d = 0;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(in_stack_ffffffffffffff10);
  if (!bVar1) {
    __stream = _stderr;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_RDI);
    string_join(in_stack_000000a8,in_stack_000000a0);
    uVar2 = std::__cxx11::string::c_str();
    fprintf(__stream,"WARNING: JSON schema conversion was incomplete: %s\n",uVar2);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff3f);
  }
  return;
}

Assistant:

void check_errors() {
        if (!_errors.empty()) {
            throw std::runtime_error("JSON schema conversion failed:\n" + string_join(_errors, "\n"));
        }
        if (!_warnings.empty()) {
            fprintf(stderr, "WARNING: JSON schema conversion was incomplete: %s\n", string_join(_warnings, "; ").c_str());
        }
    }